

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_client_handshake_message
              (ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,int is_end_of_record
              ,ptls_handshake_properties_t *properties)

{
  ptls_key_exchange_context_t **pppVar1;
  char cVar2;
  ptls_cipher_suite_t *ppVar3;
  st_ptls_get_time_t *psVar4;
  st_ptls_decompress_certificate_t *psVar5;
  st_ptls_on_extension_t *psVar6;
  ptls_buffer_t *buf;
  ptls_key_schedule_t *sched;
  size_t sVar7;
  size_t sVar8;
  st_ptls_save_ticket_t *psVar9;
  ptls_key_exchange_context_t *ppVar10;
  ptls_aead_context_t *ctx;
  ptls_key_exchange_algorithm_t *ppVar11;
  st_ptls_update_traffic_key_t *psVar12;
  ptls_iovec_t pVar13;
  ptls_iovec_t ikm;
  ptls_iovec_t nonce;
  ushort *puVar14;
  bool bVar15;
  byte bVar16;
  ushort uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  ulong uVar21;
  uint8_t *puVar22;
  uint64_t uVar23;
  uint8_t *puVar24;
  long lVar25;
  uint8_t *puVar26;
  uint uVar27;
  long lVar28;
  ptls_key_exchange_algorithm_t **pppVar29;
  ptls_message_emitter_t *emitter_00;
  undefined1 *puVar30;
  ushort uVar31;
  char *protocol;
  ptls_cipher_suite_t **pppVar32;
  ushort *end;
  ulong uVar33;
  ushort *puVar34;
  ushort *puVar35;
  ushort *puVar36;
  uint8_t *puVar37;
  ushort *puVar38;
  ptls_iovec_t pVar39;
  ptls_iovec_t context;
  ptls_iovec_t pVar40;
  ptls_iovec_t pVar41;
  ptls_iovec_t pVar42;
  ptls_iovec_t pVar43;
  ptls_iovec_t message_00;
  ptls_iovec_t pVar44;
  ushort local_2ca;
  uint16_t local_2b2;
  void *local_2a8;
  uint32_t max_early_data_size;
  ptls_buffer_t ticket_buf;
  ptls_iovec_t ticket_nonce;
  uint32_t ticket_age_add;
  uint8_t uStack_24c;
  uint8_t uStack_24b;
  uint8_t uStack_24a;
  uint8_t uStack_249;
  ushort *local_248;
  ushort local_23a;
  st_ptls_server_hello_t sh;
  
  puVar26 = (uint8_t *)message.len;
  emitter_00 = (ptls_message_emitter_t *)message.base;
  uVar27 = tls->state - PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO;
  if (0xd < uVar27) {
switchD_0011026c_caseD_8:
    __assert_fail("!\"unexpected state\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                  ,0x1160,
                  "int handle_client_handshake_message(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, int, ptls_handshake_properties_t *)"
                 );
  }
  cVar2 = *(char *)&emitter_00->buf;
  message_00.len =
       (long)&switchD_0011026c::switchdataD_00119210 +
       (long)(int)(&switchD_0011026c::switchdataD_00119210)[uVar27];
  switch(tls->state) {
  case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
  case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
    if (is_end_of_record == 0 || cVar2 != '\x02') {
      return 10;
    }
    ticket_buf.base._0_1_ = 0;
    ticket_buf.base._1_7_ = 0;
    ticket_buf.capacity = 0;
    sh.random_[0] = '\0';
    sh.random_[1] = '\0';
    sh.random_[2] = '\0';
    sh.random_[3] = '\0';
    sh.random_[4] = '\0';
    sh.random_[5] = '\0';
    sh.random_[6] = '\0';
    sh.random_[7] = '\0';
    sh.random_[8] = '\0';
    sh.random_[9] = '\0';
    sh.random_[10] = '\0';
    sh.random_[0xb] = '\0';
    sh.random_[0xc] = '\0';
    sh.random_[0xd] = '\0';
    sh.random_[0xe] = '\0';
    sh.random_[0xf] = '\0';
    sh.random_[0x10] = '\0';
    sh.random_[0x11] = '\0';
    sh.random_[0x12] = '\0';
    sh.random_[0x13] = '\0';
    sh.random_[0x14] = '\0';
    sh.random_[0x15] = '\0';
    sh.random_[0x16] = '\0';
    sh.random_[0x17] = '\0';
    sh.random_[0x18] = '\0';
    sh.random_[0x19] = '\0';
    sh.random_[0x1a] = '\0';
    sh.random_[0x1b] = '\0';
    sh.random_[0x1c] = '\0';
    sh.random_[0x1d] = '\0';
    sh.random_[0x1e] = '\0';
    sh.random_[0x1f] = '\0';
    sh.legacy_session_id.base = (uint8_t *)0x0;
    sh.legacy_session_id.len = 0;
    sh.is_retry_request = 0;
    sh._52_4_ = 0;
    sh.field_3.peerkey.base = (uint8_t *)0x0;
    sh.field_3.peerkey.len = 0;
    sh.field_3.retry_request.cookie.len = 0;
    iVar20 = 0x32;
    puVar35 = (ushort *)CONCAT44(ticket_nonce.base._4_4_,(uint)ticket_nonce.base);
    if (0x25 < (long)puVar26) {
      iVar18 = bcmp((void *)((long)&emitter_00->buf + 6),hello_retry_random,0x20);
      sh.is_retry_request = (uint)(iVar18 == 0);
      puVar35 = (ushort *)CONCAT44(ticket_nonce.base._4_4_,(uint)ticket_nonce.base);
      if ((puVar26 != (uint8_t *)0x26) &&
         (puVar22 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->commit_message + 6),
         puVar35 = (ushort *)CONCAT44(ticket_nonce.base._4_4_,(uint)ticket_nonce.base),
         puVar22 <= puVar26 + -0x27 && puVar22 < (uint8_t *)0x21)) {
        puVar34 = (ushort *)(puVar26 + (long)emitter_00);
        sh.legacy_session_id.base = (uint8_t *)((long)&emitter_00->commit_message + 7);
        puVar24 = puVar22 + (long)emitter_00;
        sh.legacy_session_id.len = (size_t)puVar22;
        puVar35 = (ushort *)CONCAT44(ticket_nonce.base._4_4_,(uint)ticket_nonce.base);
        if (1 < (long)puVar34 - (long)(puVar24 + 0x27)) {
          uVar31 = *(ushort *)(puVar24 + 0x27);
          pppVar32 = tls->ctx->cipher_suites;
          do {
            ppVar3 = *pppVar32;
            if (ppVar3 == (ptls_cipher_suite_t *)0x0) {
              tls->cipher_suite = (ptls_cipher_suite_t *)0x0;
              iVar20 = 0x2f;
              puVar35 = (ushort *)CONCAT44(ticket_nonce.base._4_4_,(uint)ticket_nonce.base);
              goto LAB_00110e92;
            }
            pppVar32 = pppVar32 + 1;
          } while (ppVar3->id != (uint16_t)(uVar31 << 8 | uVar31 >> 8));
          tls->cipher_suite = ppVar3;
          iVar20 = 0x2f;
          puVar35 = (ushort *)CONCAT44(ticket_nonce.base._4_4_,(uint)ticket_nonce.base);
          if (((ushort *)(puVar24 + 0x29) != puVar34) &&
             (puVar35 = (ushort *)CONCAT44(ticket_nonce.base._4_4_,(uint)ticket_nonce.base),
             puVar24[0x29] == '\0')) {
            if (iVar18 == 0) {
              sh.field_3.retry_request.selected_group = 0xffff;
            }
            ticket_age_add._0_1_ = '!';
            ticket_age_add._1_1_ = '$';
            ticket_age_add._2_1_ = '\x01';
            ticket_age_add._3_1_ = '\0';
            uStack_24c = '\0';
            uStack_24b = '$';
            uStack_24a = '\0';
            uStack_249 = '\0';
            iVar20 = 0x32;
            puVar35 = (ushort *)CONCAT44(ticket_nonce.base._4_4_,(uint)ticket_nonce.base);
            if (1 < (ulong)((long)puVar34 - (long)(puVar24 + 0x2a))) {
              uVar21 = (ulong)(ushort)(*(ushort *)(puVar24 + 0x2a) << 8 |
                                      *(ushort *)(puVar24 + 0x2a) >> 8);
              puVar35 = (ushort *)(puVar24 + 0x2c);
              if (uVar21 <= (ulong)((long)puVar34 - (long)puVar35)) {
                puVar38 = (ushort *)(uVar21 + (long)puVar35);
                local_2b2 = 0xffff;
                iVar18 = 0x32;
                local_2ca = 0xffff;
                puVar36 = puVar35;
                while (puVar36 != puVar38) {
                  iVar20 = iVar18;
                  if ((long)puVar38 - (long)puVar36 < 2) goto LAB_00110e92;
                  uVar31 = *puVar36 << 8 | *puVar36 >> 8;
                  local_248 = (ushort *)CONCAT62(local_248._2_6_,uVar31);
                  uVar27 = (uint)uVar31;
                  puVar14 = puVar36 + 1;
                  if ((uVar31 < 0x40) &&
                     ((*(byte *)((long)&ticket_age_add + (ulong)(uVar31 >> 3)) >> (uVar27 & 7) & 1)
                      != 0)) {
LAB_0011132d:
                    iVar20 = 0x2f;
                    puVar35 = puVar14;
                    goto LAB_00110e92;
                  }
                  ticket_nonce.base = (uint8_t *)puVar14;
                  extension_bitmap_set((st_ptls_extension_bitmap_t *)&ticket_age_add,uVar31);
                  puVar35 = (ushort *)ticket_nonce.base;
                  if ((ulong)((long)puVar38 - (long)puVar14) < 2) goto LAB_00110e92;
                  uVar17 = puVar36[1] << 8 | puVar36[1] >> 8;
                  puVar35 = puVar36 + 2;
                  if ((ulong)((long)puVar38 - (long)puVar35) < (ulong)uVar17) goto LAB_00110e92;
                  psVar6 = tls->ctx->on_extension;
                  puVar14 = puVar35;
                  if (psVar6 != (st_ptls_on_extension_t *)0x0) {
                    pVar41.len._0_2_ = uVar17;
                    pVar41.base = (uint8_t *)puVar35;
                    pVar41.len._2_6_ = 0;
                    ticket_nonce.base = (uint8_t *)puVar35;
                    iVar19 = (*psVar6->cb)(psVar6,tls,'\x02',uVar31,pVar41);
                    puVar14 = (ushort *)ticket_nonce.base;
                    if (iVar19 != 0) {
                      iVar20 = 1;
                      puVar35 = (ushort *)ticket_nonce.base;
                      goto LAB_00110e92;
                    }
                  }
                  end = (ushort *)((long)puVar35 + (ulong)uVar17);
                  puVar35 = puVar14;
                  if ((short)local_248 == 0x29) {
                    if (sh.is_retry_request != 0) goto LAB_0011132d;
                    if (uVar17 < 2) goto LAB_00110e92;
                    local_2ca = puVar36[2] << 8 | puVar36[2] >> 8;
LAB_00110605:
                    ticket_nonce.base = (uint8_t *)(puVar36 + 3);
                    puVar35 = puVar36 + 3;
                  }
                  else if (uVar27 == 0x33) {
                    if (sh.is_retry_request != 0) {
                      if (1 < uVar17) {
                        sh.field_3.retry_request.selected_group = puVar36[2] << 8 | puVar36[2] >> 8;
                        goto LAB_00110605;
                      }
                      goto LAB_00110e92;
                    }
                    ticket_nonce.base = (uint8_t *)puVar14;
                    iVar20 = decode_key_share_entry
                                       ((uint16_t *)&max_early_data_size,&sh.field_3.peerkey,
                                        &ticket_nonce.base,(uint8_t *)end);
                    puVar35 = (ushort *)ticket_nonce.base;
                    if ((iVar20 != 0) || (iVar20 = iVar18, (ushort *)ticket_nonce.base != end))
                    goto LAB_00110e92;
                    puVar14 = (ushort *)ticket_nonce.base;
                    if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) ||
                       (tls->key_share->id != (ushort)max_early_data_size)) goto LAB_0011132d;
                  }
                  else {
                    ticket_nonce.base = (uint8_t *)end;
                    if (uVar27 == 0x2c) {
                      if (sh.is_retry_request == 0) goto LAB_0011132d;
                      if (uVar17 < 2) goto LAB_00110e92;
                      uVar21 = (ulong)(ushort)(puVar36[2] << 8 | puVar36[2] >> 8);
                      puVar36 = puVar36 + 3;
                      if (((ulong)((long)end - (long)puVar36) <= uVar21 - 1) ||
                         (puVar35 = (ushort *)((long)puVar36 + uVar21),
                         sh.field_3.retry_request.cookie.base = (uint8_t *)puVar36,
                         sh.field_3.retry_request.cookie.len = uVar21, puVar35 != end))
                      goto LAB_00110e92;
                    }
                    else {
                      puVar35 = end;
                      if (uVar27 == 0x2b) {
                        puVar35 = puVar14;
                        if (1 < uVar17) {
                          local_2b2 = puVar36[2] << 8 | puVar36[2] >> 8;
                          goto LAB_00110605;
                        }
                        goto LAB_00110e92;
                      }
                    }
                  }
                  puVar36 = (ushort *)ticket_nonce.base;
                  iVar20 = iVar18;
                  if ((ushort *)ticket_nonce.base != end) goto LAB_00110e92;
                }
                if (puVar38 == puVar34) {
                  ticket_nonce.base = (uint8_t *)puVar35;
                  iVar18 = is_supported_version(local_2b2);
                  iVar20 = 0x2f;
                  puVar35 = (ushort *)ticket_nonce.base;
                  if (iVar18 != 0) {
                    iVar18 = sh.is_retry_request;
                    if (sh.is_retry_request == 0) {
                      if (local_2ca != 0xffff) {
                        if ((local_2ca != 0) ||
                           (((tls->field_18).server.pending_traffic_secret[0x38] & 1) == 0))
                        goto LAB_00110e92;
                        tls->field_0x160 = tls->field_0x160 | 2;
                      }
                      if ((sh.field_3.peerkey.base == (uint8_t *)0x0) &&
                         ((tls->field_0x160 & 2) == 0)) goto LAB_00110e92;
                    }
                    iVar20 = 0x2f;
                    if (sh.legacy_session_id.len == (tls->field_18).client.legacy_session_id.len) {
                      iVar19 = (*ptls_mem_equal)(sh.legacy_session_id.base,
                                                 (tls->field_18).client.legacy_session_id.base,
                                                 sh.legacy_session_id.len);
                      puVar35 = (ushort *)ticket_nonce.base;
                      if (iVar19 != 0) {
                        uVar27 = 0;
                        if (iVar18 == 0) {
                          if (((tls->field_18).server.pending_traffic_secret[0x38] & 1) != 0) {
                            uVar27 = (uint)((tls->field_0x160 & 2) == 0);
                          }
                          iVar20 = key_schedule_select_one
                                             (tls->key_schedule,tls->cipher_suite,uVar27);
                          puVar35 = (ushort *)ticket_nonce.base;
                          if (iVar20 == 0) {
                            if (sh.field_3.peerkey.base != (uint8_t *)0x0) {
                              pVar40.len = sh.field_3.peerkey.len;
                              pVar40.base = sh.field_3.peerkey.base;
                              iVar20 = (*((tls->field_18).client.key_share_ctx)->on_exchange)
                                                 (&(tls->field_18).client.key_share_ctx,1,
                                                  (ptls_iovec_t *)&ticket_buf,pVar40);
                              puVar35 = (ushort *)ticket_nonce.base;
                              if (iVar20 != 0) goto LAB_00110e92;
                            }
                            ptls__key_schedule_update_hash
                                      (tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar26);
                            ikm.base._1_7_ = ticket_buf.base._1_7_;
                            ikm.base._0_1_ = ticket_buf.base._0_1_;
                            ikm.len = ticket_buf.capacity;
                            iVar20 = key_schedule_extract(tls->key_schedule,ikm);
                            puVar35 = (ushort *)ticket_nonce.base;
                            if (iVar20 == 0) {
                              iVar20 = setup_traffic_protection(tls,0,"s hs traffic",2,0);
                              puVar35 = (ushort *)ticket_nonce.base;
                              if (iVar20 == 0) {
                                if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0)
                                {
                                  iVar20 = setup_traffic_protection(tls,1,"c hs traffic",2,0);
LAB_001116f5:
                                  puVar35 = (ushort *)ticket_nonce.base;
                                  if (iVar20 == 0) {
LAB_001116fd:
                                    tls->state = PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS;
                                    iVar20 = 0x202;
                                    puVar35 = (ushort *)ticket_nonce.base;
                                  }
                                }
                                else {
                                  puVar26 = (uint8_t *)malloc(0x40);
                                  tls->pending_handshake_secret = puVar26;
                                  if (puVar26 == (uint8_t *)0x0) {
                                    iVar20 = 0x201;
                                    puVar35 = (ushort *)ticket_nonce.base;
                                  }
                                  else {
                                    iVar20 = derive_secret(tls->key_schedule,puVar26,"c hs traffic")
                                    ;
                                    puVar35 = (ushort *)ticket_nonce.base;
                                    if (iVar20 == 0) {
                                      psVar12 = tls->ctx->update_traffic_key;
                                      if (psVar12 != (st_ptls_update_traffic_key_t *)0x0) {
                                        iVar20 = (*psVar12->cb)(psVar12,tls,1,2,
                                                                tls->pending_handshake_secret);
                                        goto LAB_001116f5;
                                      }
                                      goto LAB_001116fd;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          iVar20 = key_schedule_select_one(tls->key_schedule,tls->cipher_suite,0);
                          puVar35 = (ushort *)ticket_nonce.base;
                          if (iVar20 == 0) {
                            ppVar10 = (tls->field_18).client.key_share_ctx;
                            if (ppVar10 != (ptls_key_exchange_context_t *)0x0) {
                              pppVar1 = &(tls->field_18).client.key_share_ctx;
                              (*ppVar10->on_exchange)
                                        (pppVar1,1,(ptls_iovec_t *)0x0,(ptls_iovec_t)ZEXT816(0));
                              *pppVar1 = (ptls_key_exchange_context_t *)0x0;
                            }
                            bVar16 = (tls->field_18).server.pending_traffic_secret[0x38];
                            if ((bVar16 & 2) != 0) {
                              if (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)
                              {
                                ctx = (tls->traffic_protection).enc.aead;
                                if (ctx == (ptls_aead_context_t *)0x0) {
                                  __assert_fail("tls->traffic_protection.enc.aead != NULL",
                                                "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                                                ,0x8f3,
                                                "int handle_hello_retry_request(ptls_t *, ptls_message_emitter_t *, struct st_ptls_server_hello_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                                               );
                                }
                                ptls_aead_free(ctx);
                                (tls->traffic_protection).enc.aead = (ptls_aead_context_t *)0x0;
                                bVar16 = (tls->field_18).server.pending_traffic_secret[0x38];
                              }
                              (tls->field_18).server.pending_traffic_secret[0x38] = bVar16 & 0xfd;
                            }
                            if (sh.field_3.retry_request.selected_group == 0xffff) {
                              if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
                                return 0x2f;
                              }
                            }
                            else {
                              pppVar29 = tls->ctx->key_exchanges;
                              do {
                                ppVar11 = *pppVar29;
                                if (ppVar11 == (ptls_key_exchange_algorithm_t *)0x0) {
                                  return 0x2f;
                                }
                                pppVar29 = pppVar29 + 1;
                              } while (ppVar11->id != sh.field_3.retry_request.selected_group);
                              tls->key_share = ppVar11;
                            }
                            key_schedule_transform_post_ch1hash(tls->key_schedule);
                            ptls__key_schedule_update_hash
                                      (tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar26);
                            iVar20 = send_client_hello(tls,emitter,properties,
                                                       &sh.field_3.retry_request.cookie);
                            return iVar20;
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  iVar20 = 0x32;
                }
              }
            }
          }
        }
      }
    }
LAB_00110e92:
    if ((void *)CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_) == (void *)0x0) {
      return iVar20;
    }
    ticket_nonce.base = (uint8_t *)puVar35;
    (*ptls_clear_memory)
              ((void *)CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_),ticket_buf.capacity);
    puVar24 = (uint8_t *)CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_);
    goto LAB_00110eaf;
  case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
    if (cVar2 != '\b') {
      return 10;
    }
    sh.random_[0] = 0xff;
    sh.random_[1] = 0xff;
    ticket_buf.base._0_1_ = 0x20;
    ticket_buf.base._1_7_ = 0x83a00000020;
    if ((((ulong)puVar26 & 0xfffffffffffffffe) == 4) ||
       (uVar31 = *(ushort *)((long)&emitter_00->buf + 4),
       puVar22 = (uint8_t *)(ulong)(ushort)(uVar31 << 8 | uVar31 >> 8), puVar26 + -6 < puVar22)) {
      return 0x32;
    }
    local_248 = (ushort *)(puVar26 + (long)emitter_00);
    puVar34 = (ushort *)(puVar22 + (long)emitter_00 + 6);
    bVar15 = false;
    local_2a8 = (void *)0x0;
    puVar35 = (ushort *)((long)&emitter_00->buf + 6);
    while( true ) {
      while( true ) {
        while( true ) {
          if (puVar35 == puVar34) {
            if (puVar34 != local_248) {
              return 0x32;
            }
            if (tls->esni == (ptls_esni_secret_t *)0x0) {
              if (local_2a8 != (void *)0x0) {
                return 0x2f;
              }
            }
            else {
              if (local_2a8 == (void *)0x0) {
                return 0x2f;
              }
              iVar20 = (*ptls_mem_equal)(local_2a8,tls->esni->nonce,0x10);
              if (iVar20 == 0) {
                return 0x2f;
              }
              free_esni_secret(&tls->esni,0);
            }
            bVar16 = (tls->field_18).server.pending_traffic_secret[0x38];
            if ((bVar16 & 2) != 0) {
              if (!bVar15) {
                (tls->field_18).server.pending_traffic_secret[0x38] = bVar16 & 0xfd;
              }
              if (properties != (ptls_handshake_properties_t *)0x0) {
                (properties->field_0).client.early_data_acceptance =
                     bVar15 + PTLS_EARLY_DATA_REJECTED;
              }
            }
            iVar20 = report_unknown_extensions(tls,properties,(ptls_raw_extension_t *)&sh);
            if (iVar20 == 0) {
              ptls__key_schedule_update_hash
                        (tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar26);
              bVar16 = (tls->field_0x160 & 2) >> 1;
              tls->state = (uint)bVar16 + (uint)bVar16 * 2 +
                           PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE;
              return 0x202;
            }
            return iVar20;
          }
          if ((long)puVar34 - (long)puVar35 < 2) {
            return 0x32;
          }
          uVar31 = *puVar35 << 8 | *puVar35 >> 8;
          uVar27 = (uint)uVar31;
          if ((uVar31 < 0x40) &&
             ((*(byte *)((long)&ticket_buf.base + (ulong)(uVar31 >> 3)) >> (uVar27 & 7) & 1) != 0))
          {
            return 0x2f;
          }
          extension_bitmap_set((st_ptls_extension_bitmap_t *)&ticket_buf,uVar31);
          if ((ulong)((long)puVar34 - (long)(puVar35 + 1)) < 2) {
            return 0x32;
          }
          uVar17 = puVar35[1] << 8 | puVar35[1] >> 8;
          uVar21 = (ulong)uVar17;
          puVar36 = puVar35 + 2;
          if ((ulong)((long)puVar34 - (long)puVar36) < uVar21) {
            return 0x32;
          }
          psVar6 = tls->ctx->on_extension;
          if ((psVar6 != (st_ptls_on_extension_t *)0x0) &&
             (pVar42.len._0_2_ = uVar17, pVar42.base = (uint8_t *)puVar36, pVar42.len._2_6_ = 0,
             iVar20 = (*psVar6->cb)(psVar6,tls,'\b',uVar31,pVar42), iVar20 != 0)) {
            return 1;
          }
          puVar38 = (ushort *)((long)puVar35 + uVar21 + 4);
          if (uVar31 != 0) break;
          if (uVar21 != 0) {
            return 0x32;
          }
          if (tls->server_name == (char *)0x0) {
            return 0x2f;
          }
          iVar20 = ptls_server_name_is_ipaddr(tls->server_name);
          puVar35 = puVar38;
          if (iVar20 != 0) {
            return 0x2f;
          }
        }
        if (uVar27 == 0x10) break;
        if (uVar27 == 0x2a) {
          bVar15 = true;
          puVar35 = puVar38;
          if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
            return 0x2f;
          }
        }
        else if (uVar27 == 0xffce) {
          if ((uint8_t)*puVar36 != '\0') {
            return 0x208;
          }
          if (uVar17 != 0x11) {
            return 0x2f;
          }
          local_2a8 = (void *)((long)puVar35 + 5);
          puVar35 = puVar38;
        }
        else {
          handle_unknown_extension
                    (tls,properties,uVar31,(uint8_t *)puVar36,(uint8_t *)puVar38,
                     (ptls_raw_extension_t *)&sh);
          puVar35 = puVar38;
        }
      }
      if (uVar17 < 2) {
        return 0x32;
      }
      uVar21 = (ulong)(ushort)(puVar35[2] << 8 | puVar35[2] >> 8);
      if ((ulong)((long)puVar38 - (long)(puVar35 + 3)) < uVar21) {
        return 0x32;
      }
      if (uVar21 == 0) {
        return 0x32;
      }
      puVar36 = (ushort *)((long)(puVar35 + 3) + uVar21);
      uVar21 = (ulong)(byte)puVar35[3];
      protocol = (char *)((long)puVar35 + 7);
      if ((ulong)((long)puVar36 - (long)protocol) < uVar21) break;
      if (uVar21 == 0) {
        return 0x32;
      }
      iVar20 = ptls_set_negotiated_protocol(tls,protocol,uVar21);
      if (iVar20 != 0) {
        return iVar20;
      }
      if ((ushort *)(protocol + uVar21) != puVar36) {
        return 0x28;
      }
      puVar35 = puVar38;
      if (puVar36 != puVar38) {
        return 0x32;
      }
    }
    return 0x32;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
    if (cVar2 == '\v') {
LAB_00110a49:
      iVar20 = client_do_handle_certificate
                         (tls,(uint8_t *)((long)&emitter_00->buf + 4),puVar26 + (long)emitter_00);
      if (iVar20 == 0) {
        ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar26);
        tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
        return 0x202;
      }
      return iVar20;
    }
    if (cVar2 != '\x19') {
      if (cVar2 != '\r') {
        return 10;
      }
      if (puVar26 == (uint8_t *)0x4) {
        return 0x32;
      }
      puVar22 = (uint8_t *)(ulong)*(byte *)((long)&emitter_00->buf + 4);
      if (puVar26 + -5 < puVar22) {
        return 0x32;
      }
      puVar35 = (ushort *)((long)&emitter_00->buf + 5);
      puVar34 = (ushort *)((long)puVar35 + (long)puVar22);
      puVar24 = (uint8_t *)0x1;
      if (puVar22 != (uint8_t *)0x0) {
        puVar24 = puVar22;
      }
      puVar24 = (uint8_t *)malloc((size_t)puVar24);
      (tls->field_18).client.certificate_request.context.base = puVar24;
      if (puVar24 == (uint8_t *)0x0) {
        iVar20 = 0x201;
      }
      else {
        (tls->field_18).client.certificate_request.context.len = (size_t)puVar22;
        memcpy(puVar24,puVar35,(size_t)puVar22);
        iVar20 = 0x32;
        puVar35 = puVar34;
      }
      iVar18 = 0x32;
      if (puVar35 == puVar34) {
        iVar18 = iVar20;
      }
      if (puVar24 != (uint8_t *)0x0) {
        if (puVar35 != puVar34) {
          return iVar18;
        }
        puVar35 = (ushort *)((long)&emitter_00->buf + (long)puVar26);
        ticket_buf.base._0_1_ = 1;
        ticket_buf.base._1_7_ = 0x83e00000104;
        if ((ulong)((long)puVar35 - (long)puVar34) < 2) {
          return 0x32;
        }
        uVar21 = (ulong)(ushort)(*puVar34 << 8 | *puVar34 >> 8);
        puVar34 = puVar34 + 1;
        if ((ulong)((long)puVar35 - (long)puVar34) < uVar21) {
          return 0x32;
        }
        puVar38 = (ushort *)(uVar21 + (long)puVar34);
        puVar36 = (ushort *)sh.random_._0_8_;
        while( true ) {
          sh.random_._0_8_ = puVar36;
          if (puVar34 == puVar38) {
            if (puVar38 != puVar35) {
              return 0x32;
            }
            if ((tls->field_18).client.certificate_request.signature_algorithms.count != 0) {
              if ((tls->field_18).client.certificate_request.context.len == 0) {
                tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE;
                ptls__key_schedule_update_hash
                          (tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar26);
                return 0x202;
              }
              return 0x2f;
            }
            return 0x6d;
          }
          if ((long)puVar38 - (long)puVar34 < 2) {
            return 0x32;
          }
          uVar31 = *puVar34 << 8 | *puVar34 >> 8;
          if ((uVar31 < 0x40) &&
             ((*(byte *)((long)&ticket_buf.base + (ulong)(uVar31 >> 3)) >> (uVar31 & 7) & 1) != 0))
          {
            return 0x2f;
          }
          extension_bitmap_set((st_ptls_extension_bitmap_t *)&ticket_buf,uVar31);
          if ((ulong)((long)puVar38 - (long)(puVar34 + 1)) < 2) {
            return 0x32;
          }
          uVar17 = puVar34[1] << 8 | puVar34[1] >> 8;
          puVar34 = puVar34 + 2;
          if ((ulong)((long)puVar38 - (long)puVar34) < (ulong)uVar17) break;
          psVar6 = tls->ctx->on_extension;
          sh.random_._0_8_ = puVar34;
          if ((psVar6 != (st_ptls_on_extension_t *)0x0) &&
             (pVar43.len._0_2_ = uVar17, pVar43.base = (uint8_t *)puVar34, pVar43.len._2_6_ = 0,
             iVar20 = (*psVar6->cb)(psVar6,tls,'\r',uVar31,pVar43), iVar20 != 0)) {
            return 1;
          }
          puVar34 = (ushort *)((long)puVar34 + (ulong)uVar17);
          puVar36 = puVar34;
          if ((uVar31 == 0xd) &&
             (iVar20 = decode_signature_algorithms
                                 (&(tls->field_18).client.certificate_request.signature_algorithms,
                                  (uint8_t **)&sh,(uint8_t *)puVar34), iVar20 != 0)) {
            return iVar20;
          }
        }
        return 0x32;
      }
      return iVar20;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
    if (cVar2 != '\x19') {
      if (cVar2 != '\v') {
        return 10;
      }
      goto LAB_00110a49;
    }
    break;
  case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
    if (cVar2 != '\x0f') {
      return 10;
    }
    iVar20 = handle_certificate_verify(tls,message,"TLS 1.3, server CertificateVerify");
    if (iVar20 == 0) {
      tls->state = PTLS_STATE_CLIENT_EXPECT_FINISHED;
      return 0x202;
    }
    return iVar20;
  case PTLS_STATE_CLIENT_EXPECT_FINISHED:
    if (is_end_of_record == 0 || cVar2 != '\x14') {
      return 10;
    }
    iVar20 = verify_finished(tls,message);
    if (iVar20 == 0) {
      ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar26);
      iVar20 = key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
      if (((iVar20 == 0) &&
          (iVar20 = setup_traffic_protection(tls,0,"s ap traffic",3,0), iVar20 == 0)) &&
         ((iVar20 = derive_secret(tls->key_schedule,&sh,"c ap traffic"), iVar20 == 0 &&
          (iVar20 = derive_exporter_secret(tls,0), iVar20 == 0)))) {
        if (tls->pending_handshake_secret != (uint8_t *)0x0) {
          if (((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) &&
             (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)) {
            __assert_fail("tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                          ,0xb51,
                          "int client_handle_finished(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t)"
                         );
          }
          bVar16 = (tls->field_18).server.pending_traffic_secret[0x38];
          if (((bVar16 & 2) != 0) && ((tls->ctx->field_0x70 & 0x10) == 0)) {
            iVar20 = (*emitter->begin_message)(emitter);
            if (iVar20 != 0) goto LAB_001109e3;
            buf = emitter->buf;
            sched = tls->key_schedule;
            sVar7 = buf->off;
            ticket_buf.base._0_1_ = 5;
            iVar20 = ptls_buffer__do_pushv(buf,&ticket_buf,1);
            if ((iVar20 != 0) || (iVar20 = ptls_buffer__do_pushv(buf,"",3), iVar20 != 0))
            goto LAB_001109e3;
            sVar8 = buf->off;
            for (lVar28 = -3; lVar28 != 0; lVar28 = lVar28 + 1) {
              buf->base[lVar28 + sVar8] = '\0';
            }
            if (sched != (ptls_key_schedule_t *)0x0) {
              ptls__key_schedule_update_hash(sched,buf->base + sVar7,buf->off - sVar7);
            }
            iVar20 = (*emitter->commit_message)(emitter);
            if (iVar20 != 0) goto LAB_001109e3;
            bVar16 = (tls->field_18).server.pending_traffic_secret[0x38];
          }
          (tls->field_18).server.pending_traffic_secret[0x38] = bVar16 & 0xfd;
          iVar20 = commission_handshake_secret(tls);
          if (iVar20 != 0) goto LAB_001109e3;
        }
        iVar20 = push_change_cipher_spec(tls,emitter);
        if (iVar20 == 0) {
          puVar26 = (tls->field_18).client.certificate_request.context.base;
          if (puVar26 != (uint8_t *)0x0) {
            if ((tls->field_0x160 & 2) != 0) {
              iVar20 = 0x2f;
              goto LAB_001109e3;
            }
            context.len = (tls->field_18).client.certificate_request.context.len;
            context.base = puVar26;
            iVar20 = send_certificate_and_certificate_verify
                               (tls,emitter,
                                &(tls->field_18).client.certificate_request.signature_algorithms,
                                context,"TLS 1.3, client CertificateVerify",0,(uint16_t *)0x0,0);
            free((tls->field_18).client.certificate_request.context.base);
            (tls->field_18).client.certificate_request.context.base = (uint8_t *)0x0;
            (tls->field_18).client.certificate_request.context.len = 0;
            if (iVar20 != 0) goto LAB_001109e3;
          }
          send_finished(tls,emitter);
          *(undefined8 *)(tls->traffic_protection).enc.secret = sh.random_._0_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 8) = sh.random_._8_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x10) = sh.random_._16_8_;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x18) = sh.random_._24_8_;
          *(uint8_t **)((tls->traffic_protection).enc.secret + 0x20) = sh.legacy_session_id.base;
          *(size_t *)((tls->traffic_protection).enc.secret + 0x28) = sh.legacy_session_id.len;
          *(undefined8 *)((tls->traffic_protection).enc.secret + 0x30) = sh._48_8_;
          *(uint8_t **)((tls->traffic_protection).enc.secret + 0x38) = sh.field_3.peerkey.base;
          iVar20 = setup_traffic_protection(tls,1,(char *)0x0,3,0);
          if (iVar20 == 0) {
            tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
            iVar20 = 0;
          }
        }
      }
    }
LAB_001109e3:
    (*ptls_clear_memory)(&sh,0x40);
    return iVar20;
  default:
    goto switchD_0011026c_caseD_8;
  case PTLS_STATE_CLIENT_POST_HANDSHAKE:
    if (cVar2 == '\x18') {
      message_00.base = puVar26;
      iVar20 = handle_key_update(tls,emitter_00,message_00);
      return iVar20;
    }
    if (cVar2 != '\x04') {
      return 10;
    }
    puVar22 = (uint8_t *)((long)&emitter_00->buf + 4);
    iVar20 = decode_new_session_ticket
                       (tls,(uint32_t *)&ticket_buf,&ticket_age_add,&ticket_nonce,
                        (ptls_iovec_t *)&sh,&max_early_data_size,puVar22,
                        (uint8_t *)((long)&emitter_00->buf + (long)puVar26));
    if (iVar20 != 0) {
      return iVar20;
    }
    if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0) {
      return 0;
    }
    ticket_buf.base._0_1_ = SUB81(&sh,0);
    ticket_buf.base._1_7_ = (undefined7)((ulong)&sh >> 8);
    ticket_buf.off = 0;
    ticket_buf.capacity = 0x200;
    ticket_buf.is_allocated = 0;
    psVar4 = tls->ctx->get_time;
    uVar23 = (*psVar4->cb)(psVar4);
    _ticket_age_add =
         (uint8_t  [8])
         (uVar23 >> 0x38 | (uVar23 & 0xff000000000000) >> 0x28 | (uVar23 & 0xff0000000000) >> 0x18 |
          (uVar23 & 0xff00000000) >> 8 | (uVar23 & 0xff000000) << 8 | (uVar23 & 0xff0000) << 0x18 |
          (uVar23 & 0xff00) << 0x28 | uVar23 << 0x38);
    iVar20 = ptls_buffer__do_pushv(&ticket_buf,&ticket_age_add,8);
    if (iVar20 == 0) {
      uVar31 = tls->key_share->id;
      max_early_data_size._0_2_ = uVar31 << 8 | uVar31 >> 8;
      iVar20 = ptls_buffer__do_pushv(&ticket_buf,&max_early_data_size,2);
      if (iVar20 == 0) {
        uVar31 = tls->cipher_suite->id;
        local_23a = uVar31 << 8 | uVar31 >> 8;
        iVar20 = ptls_buffer__do_pushv(&ticket_buf,&local_23a,2);
        if (((iVar20 == 0) &&
            (iVar20 = ptls_buffer__do_pushv(&ticket_buf,"",3), sVar7 = ticket_buf.off, iVar20 == 0))
           && (iVar20 = ptls_buffer__do_pushv(&ticket_buf,puVar22,(size_t)(puVar26 + -4)),
              iVar20 == 0)) {
          puVar30 = (undefined1 *)
                    (sVar7 + CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_) + -3);
          for (lVar28 = 0x10; lVar28 != -8; lVar28 = lVar28 + -8) {
            *puVar30 = (char)(ticket_buf.off - sVar7 >> ((byte)lVar28 & 0x3f));
            puVar30 = puVar30 + 1;
          }
          iVar20 = ptls_buffer__do_pushv(&ticket_buf,"",2);
          sVar7 = ticket_buf.off;
          if ((iVar20 == 0) &&
             (iVar20 = ptls_buffer_reserve(&ticket_buf,
                                           (tls->key_schedule->hashes[0].algo)->digest_size),
             sVar8 = ticket_buf.off, iVar20 == 0)) {
            puVar26 = (uint8_t *)CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_);
            nonce.base._4_4_ = ticket_nonce.base._4_4_;
            nonce.base._0_4_ = (uint)ticket_nonce.base;
            nonce.len = ticket_nonce.len;
            iVar20 = derive_resumption_secret(tls->key_schedule,puVar26 + ticket_buf.off,nonce);
            if (iVar20 == 0) {
              ticket_buf.off = sVar8 + (tls->key_schedule->hashes[0].algo)->digest_size;
              puVar26[sVar7 - 2] = (uint8_t)(ticket_buf.off - sVar7 >> 8);
              puVar26[sVar7 - 1] = (uint8_t)(ticket_buf.off - sVar7);
              psVar9 = tls->ctx->save_ticket;
              pVar44.len = ticket_buf.off;
              pVar44.base = puVar26;
              iVar20 = (*psVar9->cb)(psVar9,tls,pVar44);
            }
          }
        }
      }
    }
    ptls_buffer_dispose(&ticket_buf);
    return iVar20;
  }
  if (tls->ctx->decompress_certificate == (ptls_decompress_certificate_t *)0x0) {
    iVar20 = 10;
LAB_00110a88:
    puVar24 = (uint8_t *)0x0;
  }
  else {
    iVar18 = 0x32;
    iVar20 = iVar18;
    if ((long)puVar26 < 6) goto LAB_00110a88;
    puVar22 = puVar26 + (long)emitter_00;
    uVar31 = *(ushort *)((long)&emitter_00->buf + 4);
    puVar30 = (undefined1 *)((long)&emitter_00->buf + 6);
    ticket_buf.base._0_1_ = SUB81(puVar30,0);
    ticket_buf.base._1_7_ = (undefined7)((ulong)puVar30 >> 8);
    iVar20 = ptls_decode24((uint32_t *)&ticket_nonce,&ticket_buf.base,puVar22);
    uVar27 = (uint)ticket_nonce.base;
    if (iVar20 == 0) {
      uVar21 = (ulong)(uint)ticket_nonce.base;
      if (uVar21 < 0x10001) {
        puVar24 = (uint8_t *)malloc(uVar21);
        if (puVar24 == (uint8_t *)0x0) {
          iVar20 = 0x201;
          goto LAB_00110a88;
        }
        lVar28 = CONCAT71(ticket_buf.base._1_7_,ticket_buf.base._0_1_);
        iVar20 = iVar18;
        if (2 < (ulong)((long)puVar22 - lVar28)) {
          lVar25 = 0;
          uVar33 = 0;
          do {
            uVar33 = (ulong)*(byte *)(lVar28 + lVar25) | uVar33 << 8;
            lVar25 = lVar25 + 1;
          } while (lVar25 != 3);
          puVar37 = (uint8_t *)(lVar28 + 3);
          if ((((uVar33 <= (ulong)((long)puVar22 - (long)puVar37)) &&
               (psVar5 = tls->ctx->decompress_certificate, pVar13.len = uVar33,
               pVar13.base = puVar37, pVar39.len._0_4_ = uVar27, pVar39.base = puVar24,
               pVar39.len._4_4_ = 0, sh.random_._0_8_ = puVar37, sh.random_._8_8_ = uVar33,
               iVar20 = (*psVar5->cb)(psVar5,tls,uVar31 << 8 | uVar31 >> 8,pVar39,pVar13),
               iVar20 == 0)) && (iVar20 = iVar18, puVar37 + uVar33 == puVar22)) &&
             (iVar20 = client_do_handle_certificate(tls,puVar24,puVar24 + uVar21), iVar20 == 0)) {
            ptls__key_schedule_update_hash(tls->key_schedule,(uint8_t *)emitter_00,(size_t)puVar26);
            tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
            iVar20 = 0x202;
          }
        }
      }
      else {
        puVar24 = (uint8_t *)0x0;
        iVar20 = 0x2a;
      }
    }
    else {
      puVar24 = (uint8_t *)0x0;
    }
  }
LAB_00110eaf:
  free(puVar24);
  return iVar20;
}

Assistant:

static int handle_client_handshake_message(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message, int is_end_of_record,
                                           ptls_handshake_properties_t *properties)
{
    uint8_t type = message.base[0];
    int ret;

    switch (tls->state) {
    case PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO:
    case PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO:
        if (type == PTLS_HANDSHAKE_TYPE_SERVER_HELLO && is_end_of_record) {
            ret = client_handle_hello(tls, emitter, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_ENCRYPTED_EXTENSIONS:
        if (type == PTLS_HANDSHAKE_TYPE_ENCRYPTED_EXTENSIONS) {
            ret = client_handle_encrypted_extensions(tls, message, properties);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_REQUEST_OR_CERTIFICATE:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST) {
            ret = client_handle_certificate_request(tls, message, properties);
            break;
        }
    /* fall through */
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_CERTIFICATE:
            ret = client_handle_certificate(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_COMPRESSED_CERTIFICATE:
            ret = client_handle_compressed_certificate(tls, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY:
        if (type == PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY) {
            ret = client_handle_certificate_verify(tls, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_EXPECT_FINISHED:
        if (type == PTLS_HANDSHAKE_TYPE_FINISHED && is_end_of_record) {
            ret = client_handle_finished(tls, emitter, message);
        } else {
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        }
        break;
    case PTLS_STATE_CLIENT_POST_HANDSHAKE:
        switch (type) {
        case PTLS_HANDSHAKE_TYPE_NEW_SESSION_TICKET:
            ret = client_handle_new_session_ticket(tls, message);
            break;
        case PTLS_HANDSHAKE_TYPE_KEY_UPDATE:
            ret = handle_key_update(tls, emitter, message);
            break;
        default:
            ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
            break;
        }
        break;
    default:
        assert(!"unexpected state");
        ret = PTLS_ALERT_INTERNAL_ERROR;
        break;
    }

    PTLS_PROBE(RECEIVE_MESSAGE, tls, message.base[0], message.base + PTLS_HANDSHAKE_HEADER_SIZE,
               message.len - PTLS_HANDSHAKE_HEADER_SIZE, ret);

    return ret;
}